

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ShuffleTests(UnitTestImpl *this)

{
  TestCase *pTVar1;
  reference ppTVar2;
  UnitTestImpl *in_RDI;
  size_t i;
  vector<int,_std::allocator<int>_> *in_stack_00000070;
  int in_stack_00000078;
  int in_stack_0000007c;
  Random *in_stack_00000080;
  value_type random;
  TestCase *this_00;
  TestCase *local_10;
  
  UnitTestImpl::random(in_RDI);
  ShuffleRange<int>(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070);
  UnitTestImpl::random(in_RDI);
  std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size(&in_RDI->test_cases_)
  ;
  ShuffleRange<int>(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070);
  local_10 = (TestCase *)0x0;
  while( true ) {
    this_00 = local_10;
    pTVar1 = (TestCase *)
             std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                       (&in_RDI->test_cases_);
    if (pTVar1 <= this_00) break;
    ppTVar2 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        (&in_RDI->test_cases_,(size_type)local_10);
    random = *ppTVar2;
    UnitTestImpl::random(in_RDI);
    TestCase::ShuffleTests(this_00,(Random *)random);
    local_10 = (TestCase *)((long)&local_10->_vptr_TestCase + 1);
  }
  return;
}

Assistant:

void UnitTestImpl::ShuffleTests() {
  // Shuffles the death test cases.
  ShuffleRange(random(), 0, last_death_test_case_ + 1, &test_case_indices_);

  // Shuffles the non-death test cases.
  ShuffleRange(random(), last_death_test_case_ + 1,
               static_cast<int>(test_cases_.size()), &test_case_indices_);

  // Shuffles the tests inside each test case.
  for (size_t i = 0; i < test_cases_.size(); i++) {
    test_cases_[i]->ShuffleTests(random());
  }
}